

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  vec<unsigned_int,_int> *pvVar1;
  uint *puVar2;
  bool bVar3;
  VarData *pVVar4;
  int iVar5;
  long lVar6;
  int j;
  long lVar7;
  int i;
  long lVar8;
  int s;
  ulong uVar9;
  vec<Minisat::Solver::Watcher,_int> *pvVar10;
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::cleanAll(&this->watches);
  this_00 = &this->ca;
  for (lVar6 = 0; lVar6 < this->next_var; lVar6 = lVar6 + 1) {
    for (uVar9 = 0; uVar9 != 2; uVar9 = uVar9 + 1) {
      pvVar10 = (this->watches).occs.map.data + (uVar9 | lVar6 * 2);
      lVar8 = 0;
      for (lVar7 = 0; lVar7 < pvVar10->sz; lVar7 = lVar7 + 1) {
        ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar10->data->cref + lVar8),to);
        lVar8 = lVar8 + 8;
      }
    }
  }
  lVar6 = 0;
  do {
    if ((this->trail).sz <= lVar6) {
      pvVar1 = &this->learnts;
      lVar6 = 0;
      iVar5 = 0;
      for (lVar7 = 0; lVar7 < (this->learnts).sz; lVar7 = lVar7 + 1) {
        if (((this_00->ra).memory[*(uint *)((long)pvVar1->data + lVar6)] & 3) != 1) {
          ClauseAllocator::reloc(this_00,(CRef *)((long)pvVar1->data + lVar6),to);
          lVar8 = (long)iVar5;
          iVar5 = iVar5 + 1;
          pvVar1->data[lVar8] = pvVar1->data[lVar7];
        }
        lVar6 = lVar6 + 4;
      }
      vec<unsigned_int,_int>::shrink(pvVar1,(int)lVar7 - iVar5);
      pvVar1 = &this->clauses;
      lVar6 = 0;
      iVar5 = 0;
      for (lVar7 = 0; lVar7 < (this->clauses).sz; lVar7 = lVar7 + 1) {
        if (((this_00->ra).memory[*(uint *)((long)pvVar1->data + lVar6)] & 3) != 1) {
          ClauseAllocator::reloc(this_00,(CRef *)((long)pvVar1->data + lVar6),to);
          lVar8 = (long)iVar5;
          iVar5 = iVar5 + 1;
          pvVar1->data[lVar8] = pvVar1->data[lVar7];
        }
        lVar6 = lVar6 + 4;
      }
      vec<unsigned_int,_int>::shrink(pvVar1,(int)lVar7 - iVar5);
      return;
    }
    pVVar4 = (this->vardata).
             super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
    iVar5 = (this->trail).data[lVar6].x >> 1;
    uVar9 = (ulong)pVVar4[iVar5].reason;
    if (uVar9 != 0xffffffff) {
      puVar2 = (this_00->ra).memory;
      if ((puVar2[uVar9] & 0x10) == 0) {
        bVar3 = locked(this,(Clause *)(puVar2 + uVar9));
        if (!bVar3) goto LAB_004cd060;
        pVVar4 = (this->vardata).
                 super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data
        ;
      }
      ClauseAllocator::reloc(this_00,&pVVar4[iVar5].reason,to);
    }
LAB_004cd060:
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    // All watchers:
    //
    watches.cleanAll();
    for (int v = 0; v < nVars(); v++)
        for (int s = 0; s < 2; s++){
            Lit p = mkLit(v, s);
            vec<Watcher>& ws = watches[p];
            for (int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
        }

    // All reasons:
    //
    for (int i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        // Note: it is not safe to call 'locked()' on a relocated clause. This is why we keep
        // 'dangling' reasons here. It is safe and does not hurt.
        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)]))){
            assert(!isRemoved(reason(v)));
            ca.reloc(vardata[v].reason, to);
        }
    }

    // All learnt:
    //
    int i, j;
    for (i = j = 0; i < learnts.size(); i++)
        if (!isRemoved(learnts[i])){
            ca.reloc(learnts[i], to);
            learnts[j++] = learnts[i];
        }
    learnts.shrink(i - j);

    // All original:
    //
    for (i = j = 0; i < clauses.size(); i++)
        if (!isRemoved(clauses[i])){
            ca.reloc(clauses[i], to);
            clauses[j++] = clauses[i];
        }
    clauses.shrink(i - j);
}